

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall
duckdb::ART::InitializeVacuum
          (ART *this,
          unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
          *indexes)

{
  bool bVar1;
  type paVar2;
  __hashtable *__h;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_00;
  unsigned_long val;
  uchar local_31;
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  *local_30;
  
  this_00 = &this->allocators;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  ::operator->(this_00);
  val = 0;
  do {
    paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_00);
    bVar1 = FixedSizeAllocator::InitializeVacuum
                      ((FixedSizeAllocator *)
                       paVar2->_M_elems[val].
                       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    if (bVar1) {
      local_31 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val);
      local_30 = indexes;
      ::std::
      _Hashtable<unsigned_char,unsigned_char,std::allocator<unsigned_char>,std::__detail::_Identity,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_char,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_char,false>>>>
                ((_Hashtable<unsigned_char,unsigned_char,std::allocator<unsigned_char>,std::__detail::_Identity,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)indexes,&local_31,&local_30);
    }
    val = val + 1;
    shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
    ::operator->(this_00);
  } while (val != 9);
  return;
}

Assistant:

void ART::InitializeVacuum(unordered_set<uint8_t> &indexes) {
	for (idx_t i = 0; i < allocators->size(); i++) {
		if ((*allocators)[i]->InitializeVacuum()) {
			indexes.insert(NumericCast<uint8_t>(i));
		}
	}
}